

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

float deqp::gles3::Functional::MatrixCaseUtils::determinant<4>(Matrix<float,_4,_4> *mat)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float local_148;
  float fStack_144;
  undefined4 uStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  Matrix<float,_3,_3> local_b8;
  Matrix<float,_3,_3> local_94;
  Matrix<float,_3,_3> local_70;
  Matrix<float,_3,_3> local_4c;
  
  uVar6 = *(undefined8 *)((mat->m_data).m_data[1].m_data + 2);
  pfVar1 = (mat->m_data).m_data[1].m_data + 1;
  fStack_f4 = *pfVar1;
  local_148 = *pfVar1;
  fStack_144 = (mat->m_data).m_data[1].m_data[2];
  uStack_f0 = (undefined4)uVar6;
  uStack_140 = (undefined4)((ulong)uVar6 >> 0x20);
  fStack_13c = (mat->m_data).m_data[2].m_data[1];
  local_138 = (mat->m_data).m_data[2].m_data[2];
  fStack_134 = (mat->m_data).m_data[2].m_data[3];
  fStack_130 = (mat->m_data).m_data[3].m_data[1];
  fStack_12c = (mat->m_data).m_data[3].m_data[2];
  fStack_120 = (mat->m_data).m_data[0].m_data[2];
  fStack_11c = (mat->m_data).m_data[0].m_data[3];
  local_128 = (mat->m_data).m_data[3].m_data[3];
  fStack_124 = (mat->m_data).m_data[0].m_data[1];
  fVar2 = (mat->m_data).m_data[0].m_data[0];
  local_118 = fStack_13c;
  fStack_114 = local_138;
  fStack_110 = fStack_134;
  fStack_10c = fStack_130;
  local_108 = fStack_12c;
  fStack_104 = local_128;
  fStack_100 = fStack_124;
  fStack_fc = fStack_120;
  local_f8 = fStack_11c;
  uStack_ec = uStack_140;
  local_e8 = fStack_130;
  fStack_e4 = fStack_12c;
  fStack_e0 = local_128;
  fStack_dc = fStack_124;
  local_d8 = fStack_120;
  fStack_d4 = fStack_11c;
  fStack_d0 = fStack_f4;
  uStack_cc = uStack_f0;
  local_c8 = uStack_140;
  fStack_c4 = fStack_13c;
  fStack_c0 = local_138;
  fStack_bc = fStack_134;
  tcu::Matrix<float,_3,_3>::Matrix(&local_4c,&local_148);
  fVar7 = determinant<3>(&local_4c);
  fVar3 = (mat->m_data).m_data[1].m_data[0];
  tcu::Matrix<float,_3,_3>::Matrix(&local_70,&fStack_124);
  fVar8 = determinant<3>(&local_70);
  fVar4 = (mat->m_data).m_data[2].m_data[0];
  tcu::Matrix<float,_3,_3>::Matrix(&local_94,&fStack_100);
  fVar9 = determinant<3>(&local_94);
  fVar5 = (mat->m_data).m_data[3].m_data[0];
  tcu::Matrix<float,_3,_3>::Matrix(&local_b8,&fStack_dc);
  fVar10 = determinant<3>(&local_b8);
  return (fVar9 * fVar4 + (fVar7 * fVar2 - fVar8 * fVar3)) - fVar10 * fVar5;
}

Assistant:

float determinant<4> (const tcu::Matrix<float, 4, 4>& mat)
{
	const float minorMatrices[4][3*3] =
	{
		{
			mat(1,1),	mat(2,1),	mat(3,1),
			mat(1,2),	mat(2,2),	mat(3,2),
			mat(1,3),	mat(2,3),	mat(3,3),
		},
		{
			mat(1,0),	mat(2,0),	mat(3,0),
			mat(1,2),	mat(2,2),	mat(3,2),
			mat(1,3),	mat(2,3),	mat(3,3),
		},
		{
			mat(1,0),	mat(2,0),	mat(3,0),
			mat(1,1),	mat(2,1),	mat(3,1),
			mat(1,3),	mat(2,3),	mat(3,3),
		},
		{
			mat(1,0),	mat(2,0),	mat(3,0),
			mat(1,1),	mat(2,1),	mat(3,1),
			mat(1,2),	mat(2,2),	mat(3,2),
		}
	};

	return	+ mat(0,0) * determinant(tcu::Mat3(minorMatrices[0]))
			- mat(0,1) * determinant(tcu::Mat3(minorMatrices[1]))
			+ mat(0,2) * determinant(tcu::Mat3(minorMatrices[2]))
			- mat(0,3) * determinant(tcu::Mat3(minorMatrices[3]));
}